

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O1

bool TRD_AddFile(path *fname,char *fhobname,int start,int length,int autostart,bool replace,
                bool addplace,int lengthMinusVars)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  pointer pcVar4;
  char cVar5;
  long *plVar6;
  bool bVar7;
  ETrdFileName EVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  FILE *__stream;
  ulong uVar12;
  void *__ptr;
  size_t sVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  uint fatIndex;
  long lVar18;
  ulong __off;
  ulong uVar19;
  STrdHead *this;
  STrdFile *__s1;
  int Lname;
  byte longFname [12];
  byte abin [4];
  STrdHead trdHead;
  uint local_9bc;
  byte local_9b8;
  int local_9a8;
  uint local_9a4;
  undefined8 local_9a0;
  char local_998;
  undefined2 uStack_997;
  undefined1 uStack_995;
  undefined1 uStack_994;
  char cStack_993;
  byte local_992;
  byte local_991;
  undefined8 local_990;
  size_t local_988;
  char *local_980;
  ulong local_978;
  ulong local_970;
  ulong local_968;
  ulong local_960;
  ulong local_958;
  undefined8 local_950;
  long local_940 [2];
  STrdHead local_930;
  
  local_9a8 = 0;
  EVar8 = TRD_FileNameToBytes(fhobname,(byte *)&local_9a0,&local_9a8);
  cVar5 = local_998;
  if (!addplace) {
    if (EVar8 == THREE_LETTER_EXTENSION) {
      WarningById(W_TRD_EXT_3,fhobname,W_PASS3);
      if (cVar5 == 'B') {
        WarningById(W_TRD_EXT_B,fhobname,W_PASS3);
        local_9a8 = 9;
      }
    }
    else if (EVar8 == INVALID_EXTENSION) {
      WarningById(W_TRD_EXT_INVALID,fhobname,W_PASS3);
    }
  }
  if ((-1 < autostart) && (9999 < autostart || cVar5 != 'B')) {
    Warning("zx.trdimage_add_file: autostart value is BASIC program line number (0..9999) (in lua use -1 otherwise)."
            ,(char *)0x0,W_PASS3);
    autostart = 0xffffffff;
  }
  if (lengthMinusVars != -1) {
    if (cVar5 != 'B') {
      pcVar17 = "zx.trdimage_add_file: length without variables is for BASIC files only.";
      goto LAB_0011aade;
    }
    if (lengthMinusVars < 0 || length < lengthMinusVars) {
      pcVar17 = "zx.trdimage_add_file: length without variables is not in <0..length> range.";
      goto LAB_0011aade;
    }
  }
  if (DeviceID == (char *)0x0) {
    pcVar17 = "zx.trdimage_add_file: this function available only in real device emulation mode.";
LAB_0011aade:
    Error(pcVar17,(char *)0x0,PASS3);
    return false;
  }
  if (0xffff < (uint)start) {
    pcVar17 = "zx.trdimage_add_file: start address must be in 0000..FFFF range";
LAB_0011ad35:
    Error(pcVar17,bp,PASS3);
    return false;
  }
  if (length - 0xff01U < 0xffff0100) {
    pcVar17 = "zx.trdimage_add_file: length must be in 0001..FF00 range";
    goto LAB_0011ad35;
  }
  if (0x10000 < length + start) {
    pcVar17 = "zx.trdimage_add_file: provided start+length will run out of device memory";
    goto LAB_0011ad35;
  }
  uVar9 = length + (~autostart >> 0x1f) * -4 + 0xff;
  local_978 = (ulong)(uVar9 >> 8);
  uStack_995 = (undefined1)length;
  uStack_994 = (undefined1)((uint)length >> 8);
  cStack_993 = (char)(uVar9 >> 8);
  if (cVar5 == 'B') {
    uStack_997 = (short)length;
    if (lengthMinusVars != -1) {
      uStack_995 = (undefined1)lengthMinusVars;
      uStack_994 = (undefined1)((uint)lengthMinusVars >> 8);
    }
  }
  else if (local_9a8 < 10) {
    uStack_997 = (short)start;
  }
  if (cStack_993 == '\0') {
    pcVar17 = "zx.trdimage_add_file: sector length over 0xFF max";
    cStack_993 = 0;
    goto LAB_0011ad35;
  }
  __stream = (FILE *)SJ_fopen(fname,"r+b");
  if (__stream == (FILE *)0x0) {
    ReturnWithError("Error opening file",fname,(FILE *)0x0);
    return false;
  }
  memset(&local_930.info,0,0xe2);
  local_930.info.freeTrack = '\x01';
  local_930.info.diskType = '\x16';
  local_930.info.numOfFiles = 0;
  local_930.info.numOfFreeSectors = 0x9f0;
  local_930.info.trDosId = '\x10';
  local_930.info._unused2[0] = '\0';
  local_930.info._unused2[1] = '\0';
  builtin_memcpy(local_930.info.password,"         ",9);
  local_930.info._unused3[0] = '\0';
  local_930.info.numOfDeleted = '\0';
  builtin_memcpy(local_930.info.label,"        ",8);
  local_930.info._unused4[0] = '\0';
  local_930.info._unused4[1] = '\0';
  local_930.info._unused4[2] = '\0';
  this = &local_930;
  bVar7 = STrdHead::readFromFile(this,(FILE *)__stream);
  if (!bVar7) {
    pcVar17 = "TRD image read error";
    goto LAB_0011af4a;
  }
  local_9b8 = local_930.info.numOfDeleted;
  local_988 = (size_t)local_9a8;
  local_9bc = 0x80;
  lVar18 = 0;
  do {
    if (this->catalog[0].filename[0] == '\0') {
      bVar7 = true;
    }
    else {
      iVar10 = bcmp(this,&local_9a0,local_988);
      bVar7 = false;
      if (iVar10 == 0) {
        if (((addplace) || (replace)) && (local_9bc != 0x80)) {
          local_930.catalog[local_9bc].filename[0] = '\x01';
          local_9b8 = local_9b8 + '\x01';
          local_930.info.numOfDeleted = local_9b8;
        }
        bVar7 = false;
        local_9bc = (uint)lVar18;
      }
    }
    pcVar17 = W_TRD_DUPLICATE;
    if (bVar7) break;
    lVar18 = lVar18 + 1;
    this = (STrdHead *)(this->catalog + 1);
  } while (lVar18 != 0x80);
  if (addplace) {
    if (local_9bc == 0x80) {
      pcVar17 = "TRD image does not have a specified file to add data";
      goto LAB_0011af4a;
    }
  }
  else {
    if (replace) {
      if (local_9bc != 0x80) {
        uVar12 = (ulong)local_9bc;
        if (local_9bc + 1 == (uint)local_930.info.numOfFiles) {
          bVar3 = local_930.catalog[uVar12].sectorLength;
          bVar1 = local_930.catalog[uVar12].startSector;
          uVar9 = (uint)bVar1 + (uint)bVar3;
          if ((uVar9 & 0xf) == (uint)local_930.info.freeSector) {
            bVar2 = local_930.catalog[uVar12].startTrack;
            if ((byte)((char)(uVar9 >> 4) + bVar2) == local_930.info.freeTrack) {
              local_930.info.freeTrack = bVar2;
              local_930.info.numOfFreeSectors = local_930.info.numOfFreeSectors + bVar3;
              local_930.info.numOfFiles = local_930.info.numOfFiles - 1;
              local_930.info.freeSector = bVar1;
              local_930.catalog[uVar12].filename[0] = '\0';
              goto LAB_0011ae9e;
            }
          }
          pcVar17 = "TRD free sector was not connected to last file";
          goto LAB_0011af4a;
        }
        local_930.catalog[uVar12].filename[0] = '\x01';
        local_930.info.numOfDeleted = local_930.info.numOfDeleted + '\x01';
      }
    }
    else if (local_9bc != 0x80) {
      pcVar4 = (fname->_M_pathname)._M_dataplus._M_p;
      local_950 = local_940;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_950,pcVar4,pcVar4 + (fname->_M_pathname)._M_string_length);
      WarningById(pcVar17,(char *)local_950,W_PASS3);
      if (local_950 != local_940) {
        operator_delete(local_950,local_940[0] + 1);
      }
    }
LAB_0011ae9e:
    local_9bc = (uint)local_930.info.numOfFiles;
  }
  if (local_9bc == 0x80) {
    pcVar17 = "TRD image is full of files";
  }
  else {
    uVar12 = (ulong)local_9bc;
    __s1 = local_930.catalog + uVar12;
    iVar10 = bcmp(__s1,&local_9a0,(long)local_9a8);
    if (__s1->filename[0] == '\0' || iVar10 == 0) {
      if (local_930.info.numOfFreeSectors < (ushort)(local_978 & 0xff)) {
        pcVar17 = "TRD image has not enough free space";
      }
      else {
        uVar19 = 0;
        if (addplace) {
          uVar19 = (ulong)local_930.catalog[uVar12].sectorLength;
        }
        if (((uint)local_978 & 0xff) + (int)uVar19 < 0x100) {
          if (addplace) {
            pbVar14 = &local_930.catalog[uVar12].sectorLength;
            *pbVar14 = *pbVar14 + (char)local_978;
          }
          else {
            if (iVar10 == 0) {
              local_992 = local_930.catalog[uVar12].startSector;
              pbVar14 = &local_930.catalog[uVar12].startTrack;
            }
            else {
              local_992 = local_930.info.freeSector;
              pbVar14 = &local_930.info.freeTrack;
            }
            local_991 = *pbVar14;
            *(undefined8 *)__s1->filename = local_9a0;
            *(uint *)&local_930.catalog[uVar12].ext =
                 CONCAT13(uStack_995,CONCAT21(uStack_997,local_998));
            *(ushort *)((long)&local_930.catalog[uVar12].length + 1) =
                 CONCAT11(cStack_993,uStack_994);
            local_930.catalog[uVar12].startSector = local_992;
            local_930.catalog[uVar12].startTrack = local_991;
          }
          local_988 = CONCAT44(local_988._4_4_,(int)(local_978 & 0xff));
          if (addplace) {
            bVar3 = local_930.catalog[uVar12].startSector;
            local_990 = (ulong)local_930.catalog[uVar12].startTrack * 0x1000;
            local_9a4 = (uint)bVar3;
            local_968 = (ulong)bVar3 * 0x100 + local_990;
            __off = (uint)((int)uVar19 << 8) + local_968;
            uVar15 = (ulong)local_930.info.freeSector * 0x100 +
                     (ulong)local_930.info.freeTrack * 0x1000;
            uVar16 = uVar15 - __off;
            if (__off <= uVar15 && uVar16 != 0) {
              local_958 = (ulong)local_930.catalog[uVar12].sectorLength;
              local_970 = uVar16;
              local_960 = uVar19;
              __ptr = operator_new__(uVar16);
              iVar11 = fseek(__stream,__off,0);
              uVar19 = local_970;
              local_980 = "TRD image has wrong format";
              if (iVar11 != 0) {
LAB_0011b2e9:
                ReturnWithError(local_980,fname,(FILE *)__stream);
                operator_delete__(__ptr);
                return false;
              }
              sVar13 = fread(__ptr,1,local_970,__stream);
              if (uVar19 != sVar13) {
                local_980 = "TRD read error";
                goto LAB_0011b2e9;
              }
              iVar11 = fseek(__stream,(ulong)(((int)local_958 + local_9a4) * 0x100) + local_990,0);
              uVar19 = local_970;
              if (iVar11 != 0) goto LAB_0011b2e9;
              sVar13 = fwrite(__ptr,1,local_970,__stream);
              if (uVar19 != sVar13) {
                local_980 = "TRD write error";
                goto LAB_0011b2e9;
              }
              operator_delete__(__ptr);
              pbVar14 = &local_930.catalog[0].startTrack;
              uVar19 = 0;
              local_9a4 = (uint)(ushort)local_988;
              do {
                if (((STrdFile *)(pbVar14 + -0xf))->filename[0] == 0) {
                  local_990 = CONCAT44(local_990._4_4_,5);
                }
                else {
                  local_990 = CONCAT44(local_990._4_4_,7);
                  if (uVar12 != uVar19) {
                    bVar3 = pbVar14[-1];
                    uVar15 = (ulong)bVar3 * 0x100 + (ulong)*pbVar14 * 0x1000;
                    if (uVar12 <= uVar19 == uVar15 < local_968) {
                      local_990 = CONCAT44(local_990._4_4_,1);
                      ReturnWithError("TRD inconsistent catalog data",fname,(FILE *)__stream);
                    }
                    else if ((uint)local_968 <= (uint)uVar15) {
                      *pbVar14 = (char)(bVar3 + local_9a4 >> 4) + *pbVar14;
                      pbVar14[-1] = bVar3 + (char)local_978 & 0xf;
                      local_990 = (ulong)local_990._4_4_ << 0x20;
                    }
                  }
                }
                if (((int)local_990 != 7) && (iVar11 = (int)local_990, (int)local_990 != 0))
                goto LAB_0011b1b5;
                uVar19 = uVar19 + 1;
                pbVar14 = pbVar14 + 0x10;
              } while (uVar19 != 0x80);
              iVar11 = 5;
LAB_0011b1b5:
              uVar19 = local_960;
              if ((iVar11 != 0) && (iVar11 != 5)) {
                return false;
              }
            }
          }
          iVar11 = fseek(__stream,(ulong)(uint)((int)uVar19 << 8) +
                                  (ulong)local_930.catalog[uVar12].startTrack * 0x1000 +
                                  (ulong)local_930.catalog[uVar12].startSector * 0x100,0);
          if (iVar11 == 0) {
            iVar11 = SaveRAM((FILE *)__stream,start,length);
            plVar6 = local_950;
            if (iVar11 == 0) {
              pcVar17 = "TRD write device RAM error";
            }
            else {
              if (-1 < autostart && !addplace) {
                local_950._4_4_ = SUB84(plVar6,4);
                local_950._0_4_ =
                     CONCAT13((char)((uint)autostart >> 8),CONCAT12((char)autostart,0xaa80));
                sVar13 = fwrite(&local_950,1,4,__stream);
                if (sVar13 != 4) {
                  pcVar17 = "Write error";
                  goto LAB_0011af4a;
                }
              }
              local_930.info.freeTrack =
                   local_930.info.freeTrack +
                   (char)(((uint)local_988 & 0xffff) + (uint)local_930.info.freeSector >> 4);
              local_930.info.numOfFreeSectors = local_930.info.numOfFreeSectors - (short)local_988;
              local_930.info.freeSector = local_930.info.freeSector + (char)local_978 & 0xf;
              if (iVar10 != 0) {
                local_930.info.numOfFiles = local_930.info.numOfFiles + 1;
              }
              iVar10 = fseek(__stream,0,0);
              if (iVar10 == 0) {
                bVar7 = STrdHead::writeToFile(&local_930,(FILE *)__stream);
                if (bVar7) {
                  fclose(__stream);
                  return true;
                }
                pcVar17 = "TRD write error";
              }
              else {
                pcVar17 = "TRD image has wrong format";
              }
            }
          }
          else {
            pcVar17 = "TRD image has wrong format";
          }
        }
        else {
          pcVar17 = "zx.trdimage_add_file: new sector length over 0xFF max";
        }
      }
    }
    else {
      pcVar17 = "TRD inconsistent catalog data";
    }
  }
LAB_0011af4a:
  ReturnWithError(pcVar17,fname,(FILE *)__stream);
  return false;
}

Assistant:

bool TRD_AddFile(const std::filesystem::path & fname, const char* fhobname, int start, int length, int autostart, bool replace, bool addplace, int lengthMinusVars) {
	// do some preliminary checks with file name and autostart - prepare final catalog entry data
	union {
		STrdFile trdf;			// structure to hold future form of catalog record about new file
		byte longFname[12];		// 12 byte access for TRD_FileNameToBytes (to avoid LGTM alert)
	};
	int Lname = 0;
	// this will overwrite also first byte of "trd.length" (12 bytes are affected, not just 11)
	const ETrdFileName nameWarning = TRD_FileNameToBytes(fhobname, longFname, Lname);
	const bool isExtensionB = ('B' == trdf.ext);
	if (!addplace) {
		if (INVALID_EXTENSION == nameWarning) {
			WarningById(W_TRD_EXT_INVALID, fhobname);
		}
		if (THREE_LETTER_EXTENSION == nameWarning) {
			WarningById(W_TRD_EXT_3, fhobname);
			if (isExtensionB) {
				WarningById(W_TRD_EXT_B, fhobname);
				Lname = STrdFile::NAME_FULL_SZ;
			}
		}
	}
	if (0 <= autostart && (!isExtensionB || 9999 < autostart)) {
		Warning("zx.trdimage_add_file: autostart value is BASIC program line number (0..9999) (in lua use -1 otherwise).");
		autostart = -1;
	}
	if (-1 != lengthMinusVars) {
		if (!isExtensionB) {
			Error("zx.trdimage_add_file: length without variables is for BASIC files only.");
			return 0;
		} else if (lengthMinusVars < 0 || length < lengthMinusVars) {
			Error("zx.trdimage_add_file: length without variables is not in <0..length> range.");
			return 0;
		}
	}

	// more validations - for Lua (or SAVETRD letting wrong values go through)
	if (!DeviceID) {
		Error("zx.trdimage_add_file: this function available only in real device emulation mode.");
		return 0;
	}
	if (start < 0 || 0xFFFF < start) {
		Error("zx.trdimage_add_file: start address must be in 0000..FFFF range", bp, PASS3);
		return 0;
	}
	if (length <= 0 || 0xFF00 < length) {
		// zero length not allowed any more, because TRD docs on internet are imprecise
		// and I'm not sure what is the correct way of saving zero length file => error
		Error("zx.trdimage_add_file: length must be in 0001..FF00 range", bp, PASS3);
		return 0;
	}
	if (0x10000 < start+length) {
		Error("zx.trdimage_add_file: provided start+length will run out of device memory", bp, PASS3);
		return 0;
	}
	trdf.length = word(length);
	trdf.sectorLength = byte((length + 255 + (0 <= autostart ? 4 : 0))>>8);
	if (isExtensionB) {
		trdf.addressLo = byte(length);
		trdf.addressHi = byte(length>>8);
		if (-1 != lengthMinusVars) trdf.length = word(lengthMinusVars);
	} else {
		if (Lname <= int(STrdFile::NAME_FULL_SZ)) {
			trdf.addressLo = byte(start);	// single letter extension => "start" field is used for start value
			trdf.addressHi = byte(start>>8);
		}
	}
	if (0 == trdf.sectorLength) {	// can overflow only when 0xFF00 length with autostart => 0
		Error("zx.trdimage_add_file: sector length over 0xFF max", bp, PASS3);
		return 0;
	}

	// read 9 sectors of disk into "trdHead" (contains root directory catalog and disk info data)
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "r+b")) return ReturnWithError("Error opening file", fname, ff);
	STrdHead trdHead;
	if (!trdHead.readFromFile(ff)) {
		return ReturnWithError("TRD image read error", fname, ff);
	}

	// check if the requested file is already on the disk
	// in "add" or "replace" mode also delete all extra ones with the same name, keeping only last
	unsigned fileIndex = STrdHead::NUM_OF_FILES_MAX;
	for (unsigned fatIndex = 0; fatIndex < STrdHead::NUM_OF_FILES_MAX; ++fatIndex) {
		auto & entry = trdHead.catalog[fatIndex];
		if (0 == entry.filename[0]) break;		// beyond last FAT record, finish the loop
		if (memcmp(entry.filename, trdf.filename, Lname)) continue;	// different file name -> continue
		// in "add" or "replace" mode delete the previous incarnations of this filename (returns only last one)
		if ((addplace || replace) && STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			// delete the previously found file (it stays in catalog as deleted file)
			trdHead.catalog[fileIndex].filename[0] = 1;
			++trdHead.info.numOfDeleted;
		}
		// remember the position of last entry with the requested file name
		fileIndex = fatIndex;
	}

	// check and process [un]found file based on the requested mode
	if (addplace) {
		// in "add" mode the file must already exist
		if (STrdHead::NUM_OF_FILES_MAX == fileIndex) {
			return ReturnWithError("TRD image does not have a specified file to add data", fname, ff);
		}
	} else if (replace) {
		// in "replace" mode delete also the last occurance
		if (STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			auto & entry = trdHead.catalog[fileIndex];
			if (fileIndex + 1 == trdHead.info.numOfFiles) {		// if last file in the catalog
				// It's last file of catalog, erase it as if it was not on disc at all
				// verify if the free space starts just where last file ends (integrity of TRD image)
				const byte nextTrack = ((entry.sectorLength + entry.startSector) >> 4) + entry.startTrack;
				const byte nextSector = (entry.sectorLength + entry.startSector) & 0x0F;
				// if file connects to first free sector, salvage the space back
				if (nextSector != trdHead.info.freeSector || nextTrack != trdHead.info.freeTrack) {
					return ReturnWithError("TRD free sector was not connected to last file", fname, ff);
				}
				// return the sectors used by file back to "free sectors" pool
				trdHead.info.freeSector = entry.startSector;
				trdHead.info.freeTrack = entry.startTrack;
				trdHead.info.numOfFreeSectors += entry.sectorLength;
				// delete the file (wipe catalog entry completely as if it was not written)
				--trdHead.info.numOfFiles;
				entry.filename[0] = 0;
			} else {
				// delete the file (but it stays in catalog as deleted file) (and new file will be added)
				entry.filename[0] = 1;
				++trdHead.info.numOfDeleted;
			}
		}
		fileIndex = trdHead.info.numOfFiles;
	} else {
		// in "normal" mode warn when file already exists
		if (STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			// to keep legacy behaviour of older sjasmplus versions, this is just warning
			// and the same file will be added to end of directory any way
			WarningById(W_TRD_DUPLICATE, fname.string().c_str());
		}
		fileIndex = trdHead.info.numOfFiles;
	}

	// fileIndex should point to valid record in catalog, verify the status and free space
	if (STrdHead::NUM_OF_FILES_MAX == fileIndex) {
		return ReturnWithError("TRD image is full of files", fname, ff);
	}
	auto & target = trdHead.catalog[fileIndex];
	const bool isNewTarget = !!memcmp(target.filename, trdf.filename, Lname);
	if (0 != target.filename[0] && isNewTarget) {
		// the target entry must have zero as first char or must have requested name
		return ReturnWithError("TRD inconsistent catalog data", fname, ff);
	}
	if (trdHead.info.numOfFreeSectors < trdf.sectorLength) {
		return ReturnWithError("TRD image has not enough free space", fname, ff);
	}
	const int keepSectors = addplace ? target.sectorLength : 0;
	if (0xFF < keepSectors + int(trdf.sectorLength)) {
		return ReturnWithError("zx.trdimage_add_file: new sector length over 0xFF max",  fname, ff);
	}

	// set the target record in catalog
	if (addplace) {
		// just add sector length, keep target.length at old value (no idea why, ask Dart Alver)
		target.sectorLength += trdf.sectorLength;
		// keeps basically EVERYTHING in the old catalog entry as it was, only sector length is raised
	} else {
		// finalize the prepared catalog entry record with starting position
		if (isNewTarget) {
			trdf.startSector = trdHead.info.freeSector;
			trdf.startTrack = trdHead.info.freeTrack;
		} else {
			trdf.startSector = target.startSector;
			trdf.startTrack = target.startTrack;
		}
		// write it to the actual catalog
		target = trdf;
	}

	// in "add" mode shift all data sectors to make room for the newly added ones
	if (addplace) {
		const long targetPos = STrdDisc::fileOffset(target.startTrack, target.startSector);
		const long oldTargetEndPos = targetPos + (keepSectors * STrdDisc::SECTOR_SZ);
		const long newTargetEndPos = targetPos + (target.sectorLength * STrdDisc::SECTOR_SZ);
		const long freePos = STrdDisc::fileOffset(trdHead.info.freeTrack, trdHead.info.freeSector);
		if (oldTargetEndPos < freePos) {	// some data after old file -> shift them a bit
			// first move the data inside the TRD image
			size_t dataToMoveLength = freePos - oldTargetEndPos;
			std::unique_ptr<byte[]> dataToMove(new byte[dataToMoveLength]);
			if (nullptr == dataToMove.get()) ErrorOOM();
			if (fseek(ff, oldTargetEndPos, SEEK_SET)) {
				return ReturnWithError("TRD image has wrong format", fname, ff);
			}
			if (dataToMoveLength != fread(dataToMove.get(), 1, dataToMoveLength, ff)) {
				return ReturnWithError("TRD read error", fname, ff);
			}
			if (fseek(ff, newTargetEndPos, SEEK_SET)) {
				return ReturnWithError("TRD image has wrong format", fname, ff);
			}
			// first modification of the provided TRD file (since here, if something fails, the file is damaged)
			if (dataToMoveLength != fwrite(dataToMove.get(), 1, dataToMoveLength, ff)) {
				return ReturnWithError("TRD write error", fname, ff);
			}
			dataToMove.reset();		// delete allocated memory already here
			// adjust all catalog entries which got the content sectors shifted
			for (unsigned entryIndex = 0; entryIndex < STrdHead::NUM_OF_FILES_MAX; ++entryIndex) {
				auto & entry = trdHead.catalog[entryIndex];
				if (0 == entry.filename[0]) break;		// beyond last FAT record, finish the loop
				if (entryIndex == fileIndex) continue;	// ignore the "target" itself
				// check if all files in catalog after target are also affected by content shift and vice versa
				const long entryPos = STrdDisc::fileOffset(entry.startTrack, entry.startSector);
				if ((entryIndex < fileIndex) != (entryPos < targetPos)) {
					return ReturnWithError("TRD inconsistent catalog data", fname, ff);
				}
				if (entryPos < targetPos) continue;		// this one is ahead of the target file
				// the file got shifted content => update the catalog entry
				entry.startTrack += (trdf.sectorLength + entry.startSector) >> 4;
				entry.startSector = (trdf.sectorLength + entry.startSector) & 0x0F;
			}
		} // END if (oldTargetEndPos < freePos)
	} // END if (addplace)

	// save the new data into the TRD (content sectors)
	long writePos = STrdDisc::fileOffset(target.startTrack, target.startSector);
	writePos += keepSectors * STrdDisc::SECTOR_SZ;
	if (fseek(ff, writePos, SEEK_SET)) {
		return ReturnWithError("TRD image has wrong format", fname, ff);
	}
	if (!SaveRAM(ff, start, length)) {
		return ReturnWithError("TRD write device RAM error", fname, ff);
	}
	if (!addplace && 0 <= autostart) {
		byte abin[] {0x80, 0xAA, static_cast<byte>(autostart), static_cast<byte>(autostart>>8)};
		if (4 != fwrite(abin, 1, 4, ff)) {
			return ReturnWithError("Write error", fname, ff);
		}
	}

	// update next free sector/track position
	trdHead.info.freeTrack += (trdf.sectorLength + trdHead.info.freeSector) >> 4;
	trdHead.info.freeSector = (trdf.sectorLength + trdHead.info.freeSector) & 0x0F;
	// update remaining free sectors
	trdHead.info.numOfFreeSectors -= trdf.sectorLength;
	if (isNewTarget) ++trdHead.info.numOfFiles;

	// update whole catalog and disc info with modified data
	if (fseek(ff, 0, SEEK_SET)) {
		return ReturnWithError("TRD image has wrong format", fname, ff);
	}
	if (!trdHead.writeToFile(ff)) {
		return ReturnWithError("TRD write error", fname, ff);
	}

	fclose(ff);
	return 1;
}